

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIR.cpp
# Opt level: O0

void __thiscall FIR::lowpass(FIR *this,int M,double f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 in_ESI;
  FIR *in_RDI;
  double in_XMM0_Qa;
  int i;
  int W;
  int M_1;
  int in_stack_ffffffffffffffcc;
  char a;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  
  setTaps(in_RDI,in_stack_ffffffffffffffcc);
  a = (char)((uint)in_stack_ffffffffffffffcc >> 0x18);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (size_type)in_XMM0_Qa);
  if ((in_XMM0_Qa < 0.0) || (0.5 < in_XMM0_Qa)) {
    printf("\nThe frequency is not normalized\n");
  }
  else {
    setFreq((FIR *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_XMM0_Qa,in_stack_ffffffffffffffe4);
    setType(in_RDI,a);
    iVar1 = getTaps(in_RDI);
    iVar2 = iVar1 / 2;
    for (iVar3 = -iVar2; iVar3 < iVar2; iVar3 = iVar3 + 1) {
      if (iVar3 == 0) {
        setCoeff((FIR *)CONCAT44(iVar1,iVar2),(double)(ulong)in_stack_ffffffffffffffd8,
                 (int)((ulong)in_RDI >> 0x20));
      }
      else {
        sin(in_XMM0_Qa * 6.283185307179586 * (double)iVar3);
        setCoeff((FIR *)CONCAT44(iVar1,iVar2),(double)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                 (int)((ulong)in_RDI >> 0x20));
      }
    }
  }
  return;
}

Assistant:

void FIR::lowpass(int M, double f){
	
	this->setTaps(M);

	freq.resize(1);

	if (f<0.0 or f>0.5){printf("\nThe frequency is not normalized\n");}
	else{
		this->setFreq(f,0);
		this->setType('l');
		int M=this->getTaps();
		int W=M/2;

		for (int i=-W; i<W; i++){
			if (i==0) {
				this->setCoeff(2*f,W);
			}else{		
				this->setCoeff((sin(2*(M_PI)*f*i)/(i*(M_PI))),i+W);
			}
		}
	}
}